

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * __thiscall
kj::_::Debug::makeDescription<capnp::DynamicStruct::Reader&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,Reader *params)

{
  ArrayPtr<kj::String> argValues_00;
  String argValues [1];
  
  str<capnp::DynamicStruct::Reader&>(argValues,(kj *)macroArgs,(Reader *)macroArgs);
  argValues_00.size_ = 1;
  argValues_00.ptr = argValues;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  Array<char>::~Array(&argValues[0].content);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}